

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pinifile.c
# Opt level: O1

pboolean p_ini_file_parse(PIniFile *file,PError **error)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  pchar *__s;
  size_t sVar3;
  pchar *ppVar4;
  PList *pPVar5;
  PIniSection *section;
  long lVar6;
  pchar value [1025];
  pchar src_line [1025];
  pchar key [1025];
  PIniSection *local_c60;
  undefined4 local_c58;
  char local_848 [1040];
  pchar local_438 [1032];
  
  if (file == (PIniFile *)0x0) {
    p_ini_file_parse_cold_3();
  }
  else {
    if (file->is_parsed != 0) {
      return 1;
    }
    __stream = fopen(file->path,"r");
    if (__stream != (FILE *)0x0) {
      memset(local_848,0,0x401);
      section = (PIniSection *)0x0;
      do {
        do {
          pcVar2 = fgets(local_848,0x401,__stream);
          if (pcVar2 == (char *)0x0) {
            if (section != (PIniSection *)0x0) {
              if (section->keys == (PList *)0x0) {
                pp_ini_file_section_free(section);
              }
              else {
                pPVar5 = p_list_append(file->sections,section);
                file->sections = pPVar5;
              }
            }
            iVar1 = fclose(__stream);
            if (iVar1 != 0) {
              printf("** Warning: %s **\n","PIniFile::p_ini_file_parse: fclose() failed");
            }
            file->is_parsed = 1;
            return 1;
          }
          lVar6 = 3;
          if (((local_848[2] != -0x41 || (local_848[1] != -0x45 || local_848[0] != -0x11)) &&
              (lVar6 = 2, local_848[1] != -1 || local_848[0] != -2)) &&
             (local_848[1] != -2 || local_848[0] != -1)) {
            lVar6 = (ulong)(local_848[3] == -1 &&
                           (local_848[2] == -2 && (local_848[0] == '\0' && local_848[1] == '\0')))
                    << 2;
          }
          __s = p_strchomp(local_848 + lVar6);
        } while (__s == (pchar *)0x0);
        sVar3 = strlen(__s);
        if (0x400 < sVar3) {
          __s[0x400] = '\0';
        }
        if (((*__s == '[') && (sVar3 = strlen(__s), __s[sVar3 - 1] == ']')) &&
           (iVar1 = __isoc99_sscanf(__s,"[%[^]]",local_438), iVar1 == 1)) {
          ppVar4 = p_strchomp(local_438);
          if (ppVar4 != (pchar *)0x0) {
            sVar3 = strlen(ppVar4);
            if (0x400 < sVar3) {
              ppVar4[0x400] = '\0';
            }
            strcpy(local_438,ppVar4);
            p_free(ppVar4);
            if (section != (PIniSection *)0x0) {
              if (section->keys == (PList *)0x0) {
                pp_ini_file_section_free(section);
              }
              else {
                pPVar5 = p_list_prepend(file->sections,section);
                file->sections = pPVar5;
              }
            }
            section = (PIniSection *)p_malloc0(0x10);
            if (section != (PIniSection *)0x0) {
              ppVar4 = p_strdup(local_438);
              section->name = ppVar4;
              if (ppVar4 != (pchar *)0x0) goto LAB_00114c5f;
              p_free(section);
            }
LAB_00114c18:
            section = (PIniSection *)0x0;
          }
        }
        else {
          iVar1 = __isoc99_sscanf(__s,"%[^=] = \"%[^\"]\"",local_438,&local_c58);
          if ((((iVar1 == 2) ||
               (iVar1 = __isoc99_sscanf(__s,"%[^=] = \'%[^\']\'",local_438,&local_c58), iVar1 == 2))
              || (iVar1 = __isoc99_sscanf(__s,"%[^=] = %[^;#]",local_438,&local_c58), iVar1 == 2))
             && (ppVar4 = p_strchomp(local_438), ppVar4 != (pchar *)0x0)) {
            sVar3 = strlen(ppVar4);
            if (0x400 < sVar3) {
              ppVar4[0x400] = '\0';
            }
            strcpy(local_438,ppVar4);
            p_free(ppVar4);
            ppVar4 = p_strchomp((pchar *)&local_c58);
            if (ppVar4 != (pchar *)0x0) {
              sVar3 = strlen(ppVar4);
              if (0x400 < sVar3) {
                ppVar4[0x400] = '\0';
              }
              strcpy((char *)&local_c58,ppVar4);
              p_free(ppVar4);
              if ((local_c58._2_1_ == '\0' && (short)local_c58 == 0x2222) ||
                 (local_c58._2_1_ == '\0' && (short)local_c58 == 0x2727)) {
                local_c58 = local_c58 & 0xffffff00;
              }
              if (section == (PIniSection *)0x0) goto LAB_00114c18;
              p_ini_file_parse_cold_1();
              section = local_c60;
            }
          }
        }
LAB_00114c5f:
        p_free(__s);
        memset(local_848,0,0x401);
      } while( true );
    }
    p_ini_file_parse_cold_2();
  }
  return 0;
}

Assistant:

P_LIB_API pboolean
p_ini_file_parse (PIniFile	*file,
		  PError	**error)
{
	PIniSection	*section;
	PIniParameter	*param;
	FILE		*in_file;
	pchar		*dst_line;
	pchar		*tmp_str;
	pchar		src_line[P_INI_FILE_MAX_LINE + 1];
	pchar		key[P_INI_FILE_MAX_LINE + 1];
	pchar		value[P_INI_FILE_MAX_LINE + 1];
	pint		bom_shift;

	if (P_UNLIKELY (file == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	if (file->is_parsed)
		return TRUE;

	if (P_UNLIKELY ((in_file = fopen (file->path, "r")) == NULL)) {
		p_error_set_error_p (error,
				     (pint) p_error_get_last_io (),
				     p_error_get_last_system (),
				     "Failed to open file for reading");
		return FALSE;
	}

	dst_line = NULL;
	section  = NULL;
	param    = NULL;

	memset (src_line, 0, sizeof (src_line));

	while (fgets (src_line, sizeof (src_line), in_file) != NULL) {
		/* UTF-8, UTF-16 and UTF-32 BOM detection */
		if ((puchar) src_line[0] == 0xEF && (puchar) src_line[1] == 0xBB && (puchar) src_line[2] == 0xBF)
			bom_shift = 3;
		else if (((puchar) src_line[0] == 0xFE && (puchar) src_line[1] == 0xFF) ||
			 ((puchar) src_line[0] == 0xFF && (puchar) src_line[1] == 0xFE))
			bom_shift = 2;
		else if ((puchar) src_line[0] == 0x00 && (puchar) src_line[1] == 0x00 &&
			 (puchar) src_line[2] == 0xFE && (puchar) src_line[3] == 0xFF)
			bom_shift = 4;
		else if ((puchar) src_line[0] == 0xFF && (puchar) src_line[1] == 0xFE &&
			 (puchar) src_line[2] == 0x00 && (puchar) src_line[3] == 0x00)
			bom_shift = 4;
		else
			bom_shift = 0;

		dst_line = p_strchomp (src_line + bom_shift);

		if (dst_line == NULL)
			continue;

		/* This should not happen */
		if (P_UNLIKELY (strlen (dst_line) > P_INI_FILE_MAX_LINE))
			dst_line[P_INI_FILE_MAX_LINE] = '\0';

		if (dst_line[0] == '[' && dst_line[strlen (dst_line) - 1] == ']' &&
		    sscanf (dst_line, "[%[^]]", key) == 1) {
			/* New section found */
			if ((tmp_str = p_strchomp (key)) != NULL) {
				/* This should not happen */
				if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
					tmp_str[P_INI_FILE_MAX_LINE] = '\0';

				strcpy (key, tmp_str);
				p_free (tmp_str);

				if (section != NULL) {
					if (section->keys == NULL)
						pp_ini_file_section_free (section);
					else
						file->sections = p_list_prepend (file->sections, section);
				}

				section = pp_ini_file_section_new (key);
			}
		} else if (sscanf (dst_line, "%[^=] = \"%[^\"]\"", key, value) == 2 ||
			   sscanf (dst_line, "%[^=] = '%[^\']'", key, value) == 2 ||
			   sscanf (dst_line, "%[^=] = %[^;#]", key, value) == 2) {
			/* New parameter found */
			if ((tmp_str = p_strchomp (key)) != NULL) {
				/* This should not happen */
				if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
					tmp_str[P_INI_FILE_MAX_LINE] = '\0';

				strcpy (key, tmp_str);
				p_free (tmp_str);

				if ((tmp_str = p_strchomp (value)) != NULL) {
					/* This should not happen */
					if (P_UNLIKELY (strlen (tmp_str) > P_INI_FILE_MAX_LINE))
						tmp_str[P_INI_FILE_MAX_LINE] = '\0';

					strcpy (value, tmp_str);
					p_free (tmp_str);

					if (strcmp (value, "\"\"") == 0 || (strcmp (value, "''") == 0))
						value[0] = '\0';

					if (section != NULL && (param = pp_ini_file_parameter_new (key, value)) != NULL)
						section->keys = p_list_prepend (section->keys, param);
				}
			}
		}

		p_free (dst_line);
		memset (src_line, 0, sizeof (src_line));
	}

	if (section != NULL) {
		if (section->keys == NULL)
			pp_ini_file_section_free (section);
		else
			file->sections = p_list_append (file->sections, section);
	}

	if (P_UNLIKELY (fclose (in_file) != 0))
		P_WARNING ("PIniFile::p_ini_file_parse: fclose() failed");

	file->is_parsed = TRUE;

	return TRUE;
}